

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qemu-thread-posix.c
# Opt level: O0

void * qemu_thread_join(QemuThread *thread)

{
  void *local_20;
  void *ret;
  QemuThread *pQStack_10;
  int err;
  QemuThread *thread_local;
  
  pQStack_10 = thread;
  ret._4_4_ = pthread_join(thread->thread,&local_20);
  if (ret._4_4_ != 0) {
    error_exit(ret._4_4_,"qemu_thread_join");
  }
  return local_20;
}

Assistant:

void *qemu_thread_join(QemuThread *thread)
{
    int err;
    void *ret;

    err = pthread_join(thread->thread, &ret);
    if (err) {
        error_exit(err, __func__);
    }
    return ret;
}